

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void update_val_from_objs(Am_Object *cmd,Am_Value *objs_value,Am_Value_List *new_list)

{
  Am_Get_Object_Property_Value_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object obj;
  Am_Value_List obj_list;
  Am_Value_List value_list;
  Am_Value old_value;
  Am_Get_Object_Property_Value_Method get_obj_val_method;
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Value_List local_88;
  Am_Value local_78;
  Am_Value_List *local_68;
  Am_Object *local_60;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  Am_Get_Object_Property_Value_Method local_48;
  
  local_48.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_48.Call = (Am_Get_Object_Property_Value_Method_Type *)0x0;
  local_68 = new_list;
  Am_Value_List::Am_Value_List(&local_88);
  Am_Value_List::Am_Value_List(&local_98);
  local_78.type = 0;
  local_78.value.wrapper_value = (Am_Wrapper *)0x0;
  local_a0.data = (Am_Object_Data *)0x0;
  local_60 = cmd;
  pAVar3 = Am_Object::Get(cmd,0x199,0);
  Am_Get_Object_Property_Value_Method::operator=(&local_48,pAVar3);
  Am_Value_List::operator=(&local_98,objs_value);
  Am_Value_List::Start(&local_88);
  Am_Value_List::Start(&local_98);
  while( true ) {
    bVar2 = Am_Value_List::Last(&local_98);
    if (bVar2) break;
    pAVar3 = Am_Value_List::Get(&local_98);
    Am_Object::operator=(&local_a0,pAVar3);
    pAVar1 = local_48.Call;
    Am_Object::Am_Object((Am_Object *)local_50,local_60);
    Am_Object::Am_Object((Am_Object *)local_58,&local_a0);
    (*pAVar1)((Am_Object_Data *)local_50,(Am_Object_Data *)local_58,&local_78);
    Am_Object::~Am_Object((Am_Object *)local_58);
    Am_Object::~Am_Object((Am_Object *)local_50);
    Am_Value_List::Add(&local_88,&local_78,Am_TAIL,true);
    Am_Value_List::Next(&local_98);
  }
  Am_Value_List::operator=(local_68,&local_88);
  Am_Object::~Am_Object(&local_a0);
  Am_Value::~Am_Value(&local_78);
  Am_Value_List::~Am_Value_List(&local_98);
  Am_Value_List::~Am_Value_List(&local_88);
  return;
}

Assistant:

void
update_val_from_objs(Am_Object cmd, Am_Value objs_value,
                     Am_Value_List &new_list)
{
  Am_Get_Object_Property_Value_Method get_obj_val_method;
  Am_Value_List value_list, obj_list;
  Am_Value old_value;
  Am_Object obj;
  get_obj_val_method = cmd.Get(Am_GET_OBJECT_VALUE_METHOD);
  obj_list = objs_value;
  value_list.Start();
  for (obj_list.Start(); !obj_list.Last(); obj_list.Next()) {
    obj = obj_list.Get();
    get_obj_val_method.Call(cmd, obj, old_value);
    value_list.Add(old_value);
  }
  //std::cout << "update val for " << objs_value << " to " << value_list
  // <<std::endl <<std::flush;
  new_list = value_list;
}